

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server.cxx
# Opt level: O3

void __thiscall nuraft::raft_server::update_rand_timeout(raft_server *this)

{
  element_type *peVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  ptr<raft_params> params;
  undefined1 local_40 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_28;
  element_type local_20 [2];
  
  context::get_params((context *)local_40);
  iVar2 = std::chrono::_V2::system_clock::now();
  uVar3 = iVar2 * this->id_;
  uVar4 = uVar3 / 0x7fffffff << 0x1f | uVar3 / 0x7fffffff;
  local_28._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       (ulong)(uVar4 + uVar3 + (uint)(uVar3 + uVar4 == 0));
  local_40._16_8_ =
       CONCAT44(*(undefined4 *)(_func_int ***)local_40._0_8_,
                *(undefined4 *)((long)(_func_int ***)local_40._0_8_ + 4));
  std::function<int()>::operator=
            ((function<int()> *)&this->rand_timeout_,
             (_Bind<std::uniform_int_distribution<int>_(std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>)>
              *)(local_40 + 0x10));
  peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1 != (element_type *)0x0) {
    iVar2 = (*peVar1->_vptr_logger[7])();
    if (3 < iVar2) {
      peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      msg_if_given_abi_cxx11_
                ((string *)(local_40 + 0x10),"new timeout range: %d -- %d",
                 (ulong)*(uint *)((long)(_func_int ***)local_40._0_8_ + 4),
                 (ulong)*(uint *)(_func_int ***)local_40._0_8_);
      (*peVar1->_vptr_logger[8])
                (peVar1,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                 ,"update_rand_timeout",0x158,local_40 + 0x10);
      if ((element_type *)local_40._16_8_ != local_20) {
        operator_delete((void *)local_40._16_8_);
      }
    }
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_40._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_40._8_8_);
  }
  return;
}

Assistant:

void raft_server::update_rand_timeout() {
    ptr<raft_params> params = ctx_->get_params();
    uint seed = (uint)( std::chrono::system_clock::now()
                           .time_since_epoch().count() * id_ );
    std::default_random_engine engine(seed);
    std::uniform_int_distribution<int32>
        distribution( params->election_timeout_lower_bound_,
                      params->election_timeout_upper_bound_ );
    rand_timeout_ = std::bind(distribution, engine);
    p_in("new timeout range: %d -- %d",
         params->election_timeout_lower_bound_,
         params->election_timeout_upper_bound_);
}